

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  sbyte sVar4;
  byte bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar9;
  char *pcVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  long *in_FS_OFFSET;
  bool bVar19;
  int sizes [16];
  uint local_78 [18];
  int iVar8;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      iVar7 = stbi__get16be(z->s);
      iVar7 = iVar7 + -2;
      lVar13 = *in_FS_OFFSET;
      do {
        if (iVar7 < 1) goto LAB_001c2783;
        psVar2 = z->s;
        pbVar11 = psVar2->img_buffer;
        if (pbVar11 < psVar2->img_buffer_end) {
LAB_001c2550:
          psVar2->img_buffer = pbVar11 + 1;
          bVar5 = *pbVar11;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar11 = psVar2->img_buffer;
            goto LAB_001c2550;
          }
          bVar5 = 0;
        }
        bVar17 = bVar5 & 0xf;
        if (bVar17 < 4 && bVar5 < 0x20) {
          lVar18 = 0;
          uVar9 = 0;
          do {
            psVar2 = z->s;
            pbVar11 = psVar2->img_buffer;
            if (pbVar11 < psVar2->img_buffer_end) {
LAB_001c25bb:
              psVar2->img_buffer = pbVar11 + 1;
              uVar14 = (uint)*pbVar11;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar11 = psVar2->img_buffer;
                goto LAB_001c25bb;
              }
              uVar14 = 0;
            }
            local_78[lVar18] = uVar14;
            uVar9 = uVar9 + uVar14;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x10);
          iVar7 = iVar7 + -0x11;
          if (bVar5 < 0x10) {
            iVar8 = stbi__build_huffman(z->huff_dc + bVar17,(int *)local_78);
            lVar18 = 8;
          }
          else {
            iVar8 = stbi__build_huffman(z->huff_ac + bVar17,(int *)local_78);
            lVar18 = 0x1a48;
          }
          if (iVar8 == 0) goto LAB_001c269f;
          if (uVar9 != 0) {
            uVar16 = 0;
            do {
              psVar2 = z->s;
              psVar12 = psVar2->img_buffer;
              if (psVar12 < psVar2->img_buffer_end) {
LAB_001c267f:
                psVar2->img_buffer = psVar12 + 1;
                sVar3 = *psVar12;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar12 = psVar2->img_buffer;
                  goto LAB_001c267f;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar17].values[uVar16 + lVar18 + -8] = sVar3;
              uVar16 = uVar16 + 1;
            } while (uVar9 != uVar16);
          }
          if (0xf < bVar5) {
            lVar18 = 0;
            do {
              uVar16 = (ulong)z->huff_ac[bVar17].fast[lVar18];
              z->fast_ac[bVar17][lVar18] = 0;
              if (uVar16 != 0xff) {
                bVar5 = z->huff_ac[bVar17].values[uVar16];
                if ((bVar5 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar17].size[uVar16];
                  uVar6 = (bVar5 & 0xf) + (ushort)bVar1;
                  if (uVar6 < 10) {
                    uVar15 = (int)lVar18 << (bVar1 & 0x1f) & 0x1ff;
                    sVar4 = (sbyte)(bVar5 & 0xf);
                    uVar14 = -1 << sVar4 | 1;
                    if (0xff < uVar15) {
                      uVar14 = 0;
                    }
                    iVar8 = uVar14 + (uVar15 >> (9U - sVar4 & 0x1f));
                    if ((char)iVar8 == iVar8) {
                      z->fast_ac[bVar17][lVar18] = (short)iVar8 * 0x100 | bVar5 & 0xfff0 | uVar6;
                    }
                  }
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0x200);
          }
          iVar7 = iVar7 - uVar9;
          bVar19 = true;
        }
        else {
          *(char **)(lVar13 + -0x20) = "bad DHT header";
LAB_001c269f:
          bVar19 = false;
        }
      } while (bVar19);
    }
    else if (m == 0xdb) {
      iVar7 = stbi__get16be(z->s);
      iVar7 = iVar7 + -2;
      lVar13 = *in_FS_OFFSET;
      do {
        if (iVar7 < 1) goto LAB_001c2783;
        psVar2 = z->s;
        pbVar11 = psVar2->img_buffer;
        if (pbVar11 < psVar2->img_buffer_end) {
LAB_001c2352:
          psVar2->img_buffer = pbVar11 + 1;
          bVar5 = *pbVar11;
        }
        else {
          if (psVar2->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar2);
            pbVar11 = psVar2->img_buffer;
            goto LAB_001c2352;
          }
          bVar5 = 0;
        }
        if ((bVar5 & 0xf0) == 0x10 || bVar5 < 0x10) {
          if (3 < (bVar5 & 0xf)) {
            pcVar10 = "bad DQT table";
            goto LAB_001c2390;
          }
          lVar18 = 0;
          do {
            psVar2 = z->s;
            if (bVar5 < 0x10) {
              pbVar11 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar11) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar6 = 0;
                  goto LAB_001c23f6;
                }
                stbi__refill_buffer(psVar2);
                pbVar11 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar11 + 1;
              uVar6 = (ushort)*pbVar11;
            }
            else {
              iVar8 = stbi__get16be(psVar2);
              uVar6 = (ushort)iVar8;
            }
LAB_001c23f6:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar18] * 2 + (ulong)((bVar5 & 0xf) << 7)) =
                 uVar6;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0x40);
          iVar7 = iVar7 + (uint)(bVar5 < 0x10) * 0x40 + -0x81;
          bVar19 = true;
        }
        else {
          pcVar10 = "bad DQT type";
LAB_001c2390:
          *(char **)(lVar13 + -0x20) = pcVar10;
          bVar19 = false;
        }
      } while (bVar19);
    }
    else {
LAB_001c2475:
      if (m != 0xfe && (m & 0xfffffff0U) != 0xe0) {
        lVar13 = *in_FS_OFFSET;
        pcVar10 = "unknown marker";
        goto LAB_001c27d0;
      }
      uVar9 = stbi__get16be(z->s);
      if (1 < uVar9) {
        if (uVar9 < 7 || m != 0xe0) {
          if (uVar9 < 0xe || m != 0xee) {
            iVar7 = uVar9 - 2;
          }
          else {
            bVar19 = true;
            lVar13 = 0;
            do {
              psVar2 = z->s;
              psVar12 = psVar2->img_buffer;
              if (psVar12 < psVar2->img_buffer_end) {
LAB_001c28cd:
                psVar2->img_buffer = psVar12 + 1;
                sVar3 = *psVar12;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar12 = psVar2->img_buffer;
                  goto LAB_001c28cd;
                }
                sVar3 = '\0';
              }
              if (sVar3 != "Adobe"[lVar13]) {
                bVar19 = false;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 6);
            if (bVar19) {
              stbi__get8(z->s);
              stbi__get16be(z->s);
              stbi__get16be(z->s);
              bVar5 = stbi__get8(z->s);
              z->app14_color_transform = (uint)bVar5;
              iVar7 = uVar9 - 0xe;
            }
            else {
              iVar7 = uVar9 - 8;
            }
          }
        }
        else {
          bVar19 = true;
          lVar13 = 0;
          do {
            psVar2 = z->s;
            psVar12 = psVar2->img_buffer;
            if (psVar12 < psVar2->img_buffer_end) {
LAB_001c2843:
              psVar2->img_buffer = psVar12 + 1;
              sVar3 = *psVar12;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                psVar12 = psVar2->img_buffer;
                goto LAB_001c2843;
              }
              sVar3 = '\0';
            }
            if (sVar3 != "JFIF"[lVar13]) {
              bVar19 = false;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 5);
          iVar7 = uVar9 - 7;
          if (bVar19) {
            z->jfif = 1;
          }
        }
        stbi__skip(z->s,iVar7);
        goto LAB_001c2955;
      }
      if (m == 0xfe) {
        pcVar10 = "bad COM len";
      }
      else {
        pcVar10 = "bad APP len";
      }
      *(char **)(*in_FS_OFFSET + -0x20) = pcVar10;
    }
  }
  else {
    if (m == 0xdd) {
      iVar7 = stbi__get16be(z->s);
      if (iVar7 == 4) {
        iVar7 = stbi__get16be(z->s);
        z->restart_interval = iVar7;
LAB_001c2955:
        bVar19 = true;
        goto LAB_001c27d9;
      }
      lVar13 = *in_FS_OFFSET;
      pcVar10 = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_001c2475;
      lVar13 = *in_FS_OFFSET;
      pcVar10 = "expected marker";
    }
LAB_001c27d0:
    *(char **)(lVar13 + -0x20) = pcVar10;
  }
  bVar19 = false;
LAB_001c27d9:
  return (int)bVar19;
LAB_001c2783:
  bVar19 = iVar7 == 0;
  goto LAB_001c27d9;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}